

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O2

void remove_mean_from_signal(void)

{
  pointer pdVar1;
  iterator __end1;
  iterator __begin1;
  pointer pdVar2;
  long lVar3;
  size_t i;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  pdVar1 = v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  lVar3 = (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar5 = 0.0;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    dVar5 = dVar5 + v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
  }
  auVar6._8_4_ = (int)((long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 0x23);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  m_s = dVar5 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
  for (pdVar2 = v_s.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = *pdVar2 - m_s;
  }
  return;
}

Assistant:

void remove_mean_from_signal() {
	double Med = 0;
	for(size_t i = 0; i < v_s.size(); i++) {
		Med += v_s[i];
	}
	m_s = Med / double(v_s.size());
	for(auto &v : v_s)v -= m_s;
}